

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

time_t Curl_getdate_capped(char *p)

{
  int iVar1;
  char *pcStack_20;
  int rc;
  time_t parsed;
  char *p_local;
  
  pcStack_20 = (char *)0xffffffffffffffff;
  parsed = (time_t)p;
  iVar1 = parsedate(p,(time_t *)&stack0xffffffffffffffe0);
  if (iVar1 == 0) {
    if (pcStack_20 == (char *)0xffffffffffffffff) {
      pcStack_20 = (char *)0x0;
    }
    p_local = pcStack_20;
  }
  else if (iVar1 == 1) {
    p_local = pcStack_20;
  }
  else {
    p_local = (char *)0xffffffffffffffff;
  }
  return (time_t)p_local;
}

Assistant:

time_t Curl_getdate_capped(const char *p)
{
  time_t parsed = -1;
  int rc = parsedate(p, &parsed);

  switch(rc) {
  case PARSEDATE_OK:
    if(parsed == (time_t)-1)
      /* avoid returning -1 for a working scenario */
      parsed++;
    return parsed;
  case PARSEDATE_LATER:
    /* this returns the maximum time value */
    return parsed;
  default:
    return -1; /* everything else is fail */
  }
  /* UNREACHABLE */
}